

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitstring_agg.cpp
# Opt level: O0

idx_t duckdb::BitStringAggOperation::GetRange<unsigned_char>(uchar min,uchar max)

{
  bool bVar1;
  undefined8 uVar2;
  unsigned_long uVar3;
  byte in_SIL;
  byte in_DIL;
  unsigned_long val;
  uchar result;
  uchar local_46 [21];
  allocator local_31;
  string local_30 [6];
  uchar in_stack_ffffffffffffffd6;
  uchar in_stack_ffffffffffffffd7;
  string *in_stack_ffffffffffffffd8;
  InvalidInputException *in_stack_ffffffffffffffe0;
  unsigned_long local_8;
  
  if (in_DIL <= in_SIL) {
    bVar1 = duckdb::TrySubtractOperator::Operation<unsigned_char,unsigned_char,unsigned_char>
                      (in_SIL,in_DIL,local_46);
    if (bVar1) {
      local_8 = NumericCast<unsigned_long,unsigned_char,void>('\0');
      uVar3 = NumericLimits<unsigned_long>::Maximum();
      if (local_8 != uVar3) {
        local_8 = local_8 + 1;
      }
    }
    else {
      local_8 = NumericLimits<unsigned_long>::Maximum();
    }
    return local_8;
  }
  local_46[1] = 1;
  uVar2 = __cxa_allocate_exception(0x10);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_30,"Invalid explicit bitstring range: Minimum (%d) > maximum (%d)",&local_31);
  InvalidInputException::InvalidInputException<unsigned_char,unsigned_char>
            (in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd7,
             in_stack_ffffffffffffffd6);
  local_46[1] = 0;
  __cxa_throw(uVar2,&InvalidInputException::typeinfo,InvalidInputException::~InvalidInputException);
}

Assistant:

static idx_t GetRange(INPUT_TYPE min, INPUT_TYPE max) {
		if (min > max) {
			throw InvalidInputException("Invalid explicit bitstring range: Minimum (%d) > maximum (%d)", min, max);
		}
		INPUT_TYPE result;
		if (!TrySubtractOperator::Operation(max, min, result)) {
			return NumericLimits<idx_t>::Maximum();
		}
		auto val = NumericCast<idx_t>(result);
		if (val == NumericLimits<idx_t>::Maximum()) {
			return val;
		}
		return val + 1;
	}